

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_linux.h
# Opt level: O3

void * snmalloc::PALLinux::reserve(size_t size)

{
  void *pvVar1;
  
  pvVar1 = mmap((void *)0x0,size,3,0x4022,-1,0);
  if (pvVar1 == (void *)0xffffffffffffffff) {
    pvVar1 = (void *)0x0;
  }
  if (pvVar1 != (void *)0x0) {
    prctl(0x53564d41,0,pvVar1,size,"snmalloc");
  }
  return pvVar1;
}

Assistant:

static void* reserve(size_t size) noexcept
    {
      void* p = PALPOSIX<PALLinux>::reserve(size);
      if (p)
      {
#  ifdef SNMALLOC_PAGEID
#    ifndef PR_SET_VMA
#      define PR_SET_VMA 0x53564d41
#      define PR_SET_VMA_ANON_NAME 0
#    endif

        /**
         *
         * If the kernel is set with CONFIG_ANON_VMA_NAME
         * the reserved pages would appear as follow
         *
         * 7fa5f0ceb000-7fa5f0e00000 rw-p 00000000 00:00 0 [anon:snmalloc]
         * 7fa5f0e00000-7fa5f1800000 rw-p 00000000 00:00 0 [anon:snmalloc]
         *
         */

        prctl(
          PR_SET_VMA,
          PR_SET_VMA_ANON_NAME,
          (unsigned long)p,
          size,
          (unsigned long)"snmalloc");
#  endif
      }
      return p;
    }